

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

void xmlSchemaFreeValue(xmlSchemaValPtr value)

{
  _xmlSchemaVal *p_Var1;
  xmlSchemaValPtr prev;
  xmlSchemaValPtr value_local;
  
  prev = value;
  while (prev != (xmlSchemaValPtr)0x0) {
    switch(prev->type) {
    case XML_SCHEMAS_STRING:
    case XML_SCHEMAS_NORMSTRING:
    case XML_SCHEMAS_TOKEN:
    case XML_SCHEMAS_LANGUAGE:
    case XML_SCHEMAS_NMTOKEN:
    case XML_SCHEMAS_NMTOKENS:
    case XML_SCHEMAS_NAME:
    case XML_SCHEMAS_NCNAME:
    case XML_SCHEMAS_ID:
    case XML_SCHEMAS_IDREF:
    case XML_SCHEMAS_IDREFS:
    case XML_SCHEMAS_ENTITY:
    case XML_SCHEMAS_ENTITIES:
    case XML_SCHEMAS_ANYURI:
    case XML_SCHEMAS_ANYSIMPLETYPE:
      if ((prev->value).decimal.lo != 0) {
        (*xmlFree)((void *)(prev->value).decimal.lo);
      }
      break;
    default:
      break;
    case XML_SCHEMAS_QNAME:
    case XML_SCHEMAS_NOTATION:
      if ((prev->value).decimal.mi != 0) {
        (*xmlFree)((prev->value).qname.uri);
      }
      if ((prev->value).decimal.lo != 0) {
        (*xmlFree)((void *)(prev->value).decimal.lo);
      }
      break;
    case XML_SCHEMAS_HEXBINARY:
      if ((prev->value).decimal.lo != 0) {
        (*xmlFree)((void *)(prev->value).decimal.lo);
      }
      break;
    case XML_SCHEMAS_BASE64BINARY:
      if ((prev->value).decimal.lo != 0) {
        (*xmlFree)((void *)(prev->value).decimal.lo);
      }
    }
    p_Var1 = prev->next;
    (*xmlFree)(prev);
    prev = p_Var1;
  }
  return;
}

Assistant:

void
xmlSchemaFreeValue(xmlSchemaValPtr value) {
    xmlSchemaValPtr prev;

    while (value != NULL) {
	switch (value->type) {
	    case XML_SCHEMAS_STRING:
	    case XML_SCHEMAS_NORMSTRING:
	    case XML_SCHEMAS_TOKEN:
	    case XML_SCHEMAS_LANGUAGE:
	    case XML_SCHEMAS_NMTOKEN:
	    case XML_SCHEMAS_NMTOKENS:
	    case XML_SCHEMAS_NAME:
	    case XML_SCHEMAS_NCNAME:
	    case XML_SCHEMAS_ID:
	    case XML_SCHEMAS_IDREF:
	    case XML_SCHEMAS_IDREFS:
	    case XML_SCHEMAS_ENTITY:
	    case XML_SCHEMAS_ENTITIES:
	    case XML_SCHEMAS_ANYURI:
	    case XML_SCHEMAS_ANYSIMPLETYPE:
		if (value->value.str != NULL)
		    xmlFree(value->value.str);
		break;
	    case XML_SCHEMAS_NOTATION:
	    case XML_SCHEMAS_QNAME:
		if (value->value.qname.uri != NULL)
		    xmlFree(value->value.qname.uri);
		if (value->value.qname.name != NULL)
		    xmlFree(value->value.qname.name);
		break;
	    case XML_SCHEMAS_HEXBINARY:
		if (value->value.hex.str != NULL)
		    xmlFree(value->value.hex.str);
		break;
	    case XML_SCHEMAS_BASE64BINARY:
		if (value->value.base64.str != NULL)
		    xmlFree(value->value.base64.str);
		break;
	    default:
		break;
	}
	prev = value;
	value = value->next;
	xmlFree(prev);
    }
}